

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O1

void __thiscall
vkt::wsi::anon_unknown_0::populateSwapchainGroup
          (anon_unknown_0 *this,TestCaseGroup *testGroup,GroupParameters params)

{
  TestContext *testCtx;
  TestNode *node;
  long lVar1;
  pointer pcVar2;
  allocator<char> local_79;
  TestContext *local_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_78 = params._0_8_;
  pcVar2 = (pointer)((ulong)testGroup & 0xffffffff);
  lVar1 = 0;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,
               (char *)((long)&
                              _ZZN3vkt3wsi12_GLOBAL__N_120getTestDimensionNameENS1_13TestDimensionEE7s_names_rel
                       + (long)*(int *)((long)&
                                              _ZZN3vkt3wsi12_GLOBAL__N_120getTestDimensionNameENS1_13TestDimensionEE7s_names_rel
                                       + lVar1)),&local_79);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
    testCtx = *(TestContext **)(this + 8);
    node = (TestNode *)operator_new(0x88);
    tcu::TestCase::TestCase
              ((TestCase *)node,testCtx,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
               (char *)local_70[0]);
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d62ad8;
    node[1].m_testCtx = local_78;
    node[1].m_name._M_dataplus._M_p = pcVar2;
    tcu::TestNode::addChild((TestNode *)this,node);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    lVar1 = lVar1 + 4;
    pcVar2 = pcVar2 + 0x100000000;
  } while (lVar1 != 0x28);
  return;
}

Assistant:

void populateSwapchainGroup (tcu::TestCaseGroup* testGroup, GroupParameters params)
{
	for (int dimensionNdx = 0; dimensionNdx < TEST_DIMENSION_LAST; ++dimensionNdx)
	{
		const TestDimension		testDimension	= (TestDimension)dimensionNdx;

		addFunctionCase(testGroup, getTestDimensionName(testDimension), "", params.function, TestParameters(params.wsiType, testDimension));
	}
}